

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.h
# Opt level: O0

bool ispring::File::DirectoryCopy(string *src,string *dst)

{
  int iVar1;
  char *__command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string cmd;
  string *dst_local;
  string *src_local;
  
  cmd.field_2._8_8_ = dst;
  std::operator+(&local_78,"cp -r ",src);
  std::operator+(&local_58,&local_78," ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,dst);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  __command = (char *)std::__cxx11::string::c_str();
  iVar1 = system(__command);
  std::__cxx11::string::~string((string *)local_38);
  return iVar1 == 0;
}

Assistant:

inline bool DirectoryCopy(std::string src, std::string dst) {
			std::string cmd="cp -r " + src + " " + dst;
			return system(cmd.c_str())==0;
		}